

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

void flip_drawbridge_horizontal(rm *loc)

{
  rm *loc_local;
  
  if ((loc->typ == '\x14') || (loc->typ == '$')) {
    if ((*(uint *)&loc->field_0x6 >> 4 & 3) == 3) {
      *(uint *)&loc->field_0x6 =
           *(uint *)&loc->field_0x6 & 0xfffffe0f | (*(uint *)&loc->field_0x6 >> 4 & 0x1c) << 4;
      *(uint *)&loc->field_0x6 =
           *(uint *)&loc->field_0x6 & 0xfffffe0f | (*(uint *)&loc->field_0x6 >> 4 & 0x1f | 2) << 4;
    }
    else if ((*(uint *)&loc->field_0x6 >> 4 & 3) == 2) {
      *(uint *)&loc->field_0x6 =
           *(uint *)&loc->field_0x6 & 0xfffffe0f | (*(uint *)&loc->field_0x6 >> 4 & 0x1d) << 4;
      *(uint *)&loc->field_0x6 =
           *(uint *)&loc->field_0x6 & 0xfffffe0f | (*(uint *)&loc->field_0x6 >> 4 & 0x1f | 3) << 4;
    }
  }
  return;
}

Assistant:

static void flip_drawbridge_horizontal(struct rm *loc)
{
	if (IS_DRAWBRIDGE(loc->typ)) {
	    if ((loc->drawbridgemask & DB_DIR) == DB_WEST) {
		loc->drawbridgemask &= ~DB_WEST;
		loc->drawbridgemask |=  DB_EAST;
	    } else if ((loc->drawbridgemask & DB_DIR) == DB_EAST) {
		loc->drawbridgemask &= ~DB_EAST;
		loc->drawbridgemask |=  DB_WEST;
	    }
	}
}